

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::invalid_request_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,invalid_request_alert *this)

{
  char *pcVar1;
  string local_1c8;
  char ret [400];
  
  peer_alert::message_abi_cxx11_(&local_1c8,&this->super_peer_alert);
  if (this->withheld == false) {
    if (this->we_have == true) {
      pcVar1 = ": peer is not interested";
      if (this->peer_interested != false) {
        pcVar1 = "";
      }
    }
    else {
      pcVar1 = ": we don\'t have piece";
    }
  }
  else {
    pcVar1 = ": super seeding withheld piece";
  }
  snprintf(ret,400,"%s peer sent an invalid piece request (piece: %d start: %d len: %d)%s",
           local_1c8._M_dataplus._M_p,(ulong)*(uint *)&(this->super_peer_alert).field_0x9c,
           (ulong)*(uint *)&this->field_0xa0,(ulong)*(uint *)&this->field_0xa4,pcVar1);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,ret,(allocator<char> *)&local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::string invalid_request_alert::message() const
	{
		char ret[400];
		std::snprintf(ret, sizeof(ret), "%s peer sent an invalid piece request "
			"(piece: %d start: %d len: %d)%s"
			, peer_alert::message().c_str()
			, static_cast<int>(request.piece)
			, request.start
			, request.length
			, withheld ? ": super seeding withheld piece"
			: !we_have ? ": we don't have piece"
			: !peer_interested ? ": peer is not interested"
			: "");
		return ret;
	}